

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

void __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::resize(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
         *this,size_type __num_elements_hint)

{
  value_type p_Var1;
  _Node *p_Var2;
  _Node *__n_00;
  reference pp_Var3;
  size_type __n_01;
  _Node *__next;
  size_type __bucket_1;
  size_type __new_bucket;
  _Node *__first;
  size_type __bucket;
  allocator_type local_49;
  value_type local_48;
  undefined1 local_40 [8];
  _M_buckets_type __tmp;
  size_type __n;
  size_type __old_n;
  size_type __num_elements_hint_local;
  hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  *this_local;
  
  p_Var2 = (_Node *)std::
                    vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                    ::size(&this->_M_buckets);
  if ((p_Var2 < __num_elements_hint) &&
     (__n_00 = (_Node *)_M_next_size(this,__num_elements_hint), p_Var2 < __n_00)) {
    local_48 = (value_type)0x0;
    __tmp.
    super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__n_00;
    std::
    _Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
    ::get_allocator((_Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                     *)&local_49);
    std::
    vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
    ::vector((vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
              *)local_40,(size_type)__n_00,&local_48,&local_49);
    std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>::~allocator
              (&local_49);
    for (__first = (_Node *)0x0; __first < p_Var2; __first = (_Node *)((long)&__first->_M_next + 1))
    {
      pp_Var3 = std::
                vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                ::operator[](&this->_M_buckets,(size_type)__first);
      __new_bucket = (size_type)*pp_Var3;
      while (__new_bucket != 0) {
        __n_01 = _M_bkt_num(this,(value_type *)(__new_bucket + 8),
                            (size_t)__tmp.
                                    super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        p_Var1 = *(value_type *)__new_bucket;
        pp_Var3 = std::
                  vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                  ::operator[](&this->_M_buckets,(size_type)__first);
        *pp_Var3 = p_Var1;
        pp_Var3 = std::
                  vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                  ::operator[]((vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                                *)local_40,__n_01);
        *(value_type *)__new_bucket = *pp_Var3;
        pp_Var3 = std::
                  vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                  ::operator[]((vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                                *)local_40,__n_01);
        *pp_Var3 = (value_type)__new_bucket;
        pp_Var3 = std::
                  vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                  ::operator[](&this->_M_buckets,(size_type)__first);
        __new_bucket = (size_type)*pp_Var3;
      }
    }
    std::
    vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
    ::swap(&this->_M_buckets,
           (vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            *)local_40);
    std::
    vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
    ::~vector((vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
               *)local_40);
  }
  return;
}

Assistant:

void hashtable<_Val, _Key, _HF, _Ex, _Eq, _All>::resize(
  size_type __num_elements_hint)
{
  const size_type __old_n = _M_buckets.size();
  if (__num_elements_hint > __old_n) {
    const size_type __n = _M_next_size(__num_elements_hint);
    if (__n > __old_n) {
      _M_buckets_type __tmp(__n, (_Node*)(0), _M_buckets.get_allocator());
      try {
        for (size_type __bucket = 0; __bucket < __old_n; ++__bucket) {
          _Node* __first = _M_buckets[__bucket];
          while (__first) {
            size_type __new_bucket = _M_bkt_num(__first->_M_val, __n);
            _M_buckets[__bucket] = __first->_M_next;
            __first->_M_next = __tmp[__new_bucket];
            __tmp[__new_bucket] = __first;
            __first = _M_buckets[__bucket];
          }
        }
        _M_buckets.swap(__tmp);
      } catch (...) {
        for (size_type __bucket = 0; __bucket < __tmp.size(); ++__bucket) {
          while (__tmp[__bucket]) {
            _Node* __next = __tmp[__bucket]->_M_next;
            _M_delete_node(__tmp[__bucket]);
            __tmp[__bucket] = __next;
          }
        }
        throw;
      }
    }
  }
}